

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O0

bool __thiscall gl4cts::GetTextureSubImage::Errors::testOneDimmensionalTextureErrors(Errors *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  char *local_1c0 [3];
  MessageBuilder local_1a8;
  uint local_28;
  int local_24;
  GLint is_proper_error;
  GLint error_value;
  Functions *gl;
  Errors *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _is_proper_error = CONCAT44(extraout_var,iVar1);
  (*this->m_gl_GetTextureSubImage)
            (this->m_texture_1D,0,0,1,0,2,2,1,0x1908,0x1401,0x10,this->m_destination_buffer);
  local_24 = (**(code **)(_is_proper_error + 0x800))();
  local_28 = (uint)(local_24 == 0x501);
  if (local_28 == 0) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1a8,
                        (char (*) [243])
                        "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if the effective target is GL_TEXTURE_1D and either yoffset is not zero, or height is not one (OpenGL 4.5 Core Specification chapter 8.11.4). However, the error value "
                       );
    local_1c0[0] = glu::getErrorName(local_24);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])0x29eb900);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  return local_28 != 0;
}

Assistant:

bool gl4cts::GetTextureSubImage::Errors::testOneDimmensionalTextureErrors()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test. */
	m_gl_GetTextureSubImage(m_texture_1D, 0, 0, 1, 0, s_texture_data_width, 2, 1, GL_RGBA, GL_UNSIGNED_BYTE,
							s_destination_buffer_size, m_destination_buffer);

	glw::GLint error_value	 = gl.getError();
	glw::GLint is_proper_error = (GL_INVALID_VALUE == error_value);

	if (!is_proper_error)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if the effective"
			   " target is GL_TEXTURE_1D and either yoffset is not zero, or height"
			   " is not one (OpenGL 4.5 Core Specification chapter 8.11.4)."
			   " However, the error value "
			<< glu::getErrorName(error_value) << " was generated." << tcu::TestLog::EndMessage;
	}

	if (is_proper_error)
	{
		return true;
	}

	return false;
}